

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O3

void k054539_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  int iVar1;
  short *psVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  short sVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint *puVar29;
  uint uVar30;
  int iVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  
  auVar15 = _DAT_0017d330;
  if ((*(byte *)((long)param + 0xb08) & 1) == 0) {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
    return;
  }
  if (samples == 0) {
    return;
  }
  lVar13 = *(long *)((long)param + 0xb10);
  bVar5 = *(byte *)((long)param + 0x8d8);
  uVar17 = (ulong)*(ushort *)((long)param + 0xb18);
  uVar21 = 0;
LAB_00167226:
  dVar32 = 0.0;
  if ((bVar5 & 2) == 0) {
    dVar32 = (double)(int)*(short *)(lVar13 + uVar17 * 2);
  }
  *(undefined2 *)(lVar13 + uVar17 * 2) = 0;
  lVar18 = 0;
  dVar33 = dVar32;
LAB_0016725a:
  bVar6 = *(byte *)((long)param + 0xb05);
  if (((bVar6 >> ((uint)lVar18 & 0x1f) & 1) != 0) &&
     (*(char *)((long)param + lVar18 + 0xbc0) == '\0')) {
    lVar19 = lVar18 * 0x20;
    bVar7 = *(byte *)((long)param + lVar19 + 0x8dc);
    uVar16 = (uint)*(byte *)((long)param + lVar19 + 0x8dd) + (uint)bVar7;
    if (0xfe < uVar16) {
      uVar16 = 0xff;
    }
    bVar20 = *(byte *)((long)param + lVar19 + 0x8de);
    if ((byte)(bVar20 + 0x7f) < 0xf) {
      uVar27 = bVar20 - 0x81;
    }
    else {
      uVar27 = bVar20 - 0x11;
      if (0xe < (byte)(bVar20 - 0x11)) {
        uVar27 = 7;
      }
    }
    puVar29 = (uint *)((long)param + lVar18 * 0x10 + 0xb40);
    uVar25 = (uint)CONCAT12(*(undefined1 *)((long)param + lVar19 + 0x8db),
                            *(undefined2 *)((long)param + lVar19 + 0x8d9));
    dVar34 = *(double *)((long)param + lVar18 * 8 + 0x880);
    dVar37 = *(double *)((long)param + (ulong)bVar7 * 8 + 8);
    dVar3 = *(double *)((long)param + (ulong)(0xe - uVar27) * 8 + 0x808);
    dVar4 = *(double *)((long)param + (ulong)uVar27 * 8 + 0x808);
    dVar36 = *(double *)((long)param + (ulong)uVar16 * 8 + 8) * dVar34 * 0.5;
    uVar10 = *(ushort *)((long)param + lVar19 + 0x8df);
    uVar11 = *(ushort *)((long)param + 0xb18);
    uVar16 = (uint)CONCAT12(*(undefined1 *)((long)param + lVar19 + 0x8e7),
                            *(undefined2 *)((long)param + lVar19 + 0x8e5));
    bVar7 = *(byte *)((long)param + lVar18 * 2 + 0xad9);
    uVar17 = (ulong)bVar7 & 0xffffffffffffff20;
    uVar27 = -uVar25;
    if ((char)uVar17 == '\0') {
      uVar27 = uVar25;
    }
    uVar25 = (uint)(byte)(uVar17 >> 5);
    iVar31 = uVar25 * 0x20000 + -0x10000;
    uVar25 = -uVar25 | 1;
    bVar20 = (byte)(1 << ((byte)lVar18 & 0x1f));
    if (uVar16 == *puVar29) {
      uVar26 = puVar29[1];
      uVar24 = puVar29[2];
      uVar28 = puVar29[3];
      uVar30 = uVar26;
      uVar23 = uVar24;
      switch(bVar7 >> 2 & 3) {
      case 0:
switchD_001673d6_caseD_0:
        uVar24 = uVar23;
        uVar30 = uVar26 + uVar27;
        if (0xffff < uVar30) {
          do {
            uVar28 = uVar24;
            uVar26 = uVar30;
            uVar16 = uVar16 + uVar25;
            bVar7 = *(byte *)(*(long *)((long)param + 0xb30) +
                             (ulong)(*(uint *)((long)param + 0xb3c) & uVar16));
            if (bVar7 == 0x80) {
              if ((*(byte *)((long)param + lVar18 * 2 + 0xada) & 1) == 0) goto LAB_00167599;
              uVar16 = (uint)CONCAT12(*(undefined1 *)((long)param + lVar19 + 0x8e3),
                                      *(undefined2 *)((long)param + lVar19 + 0x8e1));
              bVar7 = *(byte *)(*(long *)((long)param + 0xb30) +
                               (ulong)(*(uint *)((long)param + 0xb3c) & uVar16));
              if (bVar7 == 0x80) goto LAB_00167599;
            }
            uVar24 = (uint)(short)((ushort)bVar7 << 8);
            uVar30 = uVar26 + iVar31;
          } while (0xffff < uVar26 + iVar31);
LAB_00167591:
          uVar30 = uVar26 + iVar31;
        }
        break;
      case 1:
switchD_001673d6_caseD_1:
        uVar24 = uVar23;
        uVar30 = uVar26 + uVar27;
        if (0xffff < uVar30) {
          lVar14 = *(long *)((long)param + 0xb30);
          uVar27 = *(uint *)((long)param + 0xb3c);
          do {
            uVar28 = uVar24;
            uVar26 = uVar30;
            iVar1 = uVar16 + uVar25 * 2;
            uVar16 = uVar16 + uVar25 * 2;
            uVar8 = *(undefined1 *)(lVar14 + (ulong)(uVar27 & uVar16));
            uVar9 = *(undefined1 *)(lVar14 + (ulong)(iVar1 + 1U & uVar27));
            sVar22 = CONCAT11(uVar9,uVar8);
            if (CONCAT11(uVar9,uVar8) == -0x8000) {
              if ((*(byte *)((long)param + lVar18 * 2 + 0xada) & 1) == 0) goto LAB_00167599;
              uVar12 = *(ushort *)((long)param + lVar19 + 0x8e1);
              bVar7 = *(byte *)((long)param + lVar19 + 0x8e3);
              uVar16 = (uint)bVar7 * 0x10000 + (uint)uVar12;
              uVar8 = *(undefined1 *)(lVar14 + (ulong)(uVar27 & uVar16));
              uVar9 = *(undefined1 *)(lVar14 + (ulong)(uVar27 & CONCAT12(bVar7,uVar12) + 1));
              sVar22 = CONCAT11(uVar9,uVar8);
              if (CONCAT11(uVar9,uVar8) == -0x8000) goto LAB_00167599;
            }
            uVar24 = (uint)sVar22;
            uVar30 = uVar26 + iVar31;
          } while (0xffff < uVar26 + iVar31);
          goto LAB_00167591;
        }
        break;
      case 2:
switchD_001673d6_caseD_2:
        uVar24 = uVar23;
        uVar16 = ((uVar26 & 0x8000) >> 0xf) + uVar16 * 2;
        uVar30 = uVar26 * 2 & 0xffff;
        if ((uVar26 & 0x8000) == 0) {
          uVar30 = uVar26 * 2;
        }
        uVar30 = uVar30 + uVar27;
        if (0xffff < uVar30) {
          do {
            uVar28 = uVar24;
            uVar27 = uVar30;
            uVar16 = uVar16 + uVar25;
            bVar7 = *(byte *)(*(long *)((long)param + 0xb30) +
                             (ulong)(uVar16 >> 1 & *(uint *)((long)param + 0xb3c)));
            if (bVar7 == 0x88) {
              if ((*(byte *)((long)param + lVar18 * 2 + 0xada) & 1) != 0) {
                uVar16 = (uint)*(byte *)((long)param + lVar19 + 0x8e3) * 0x20000 +
                         (uint)*(ushort *)((long)param + lVar19 + 0x8e1) * 2;
                bVar7 = *(byte *)(*(long *)((long)param + 0xb30) +
                                 (ulong)(*(uint *)((long)param + 0xb3c) & uVar16 >> 1));
                if (bVar7 != 0x88) goto LAB_00167625;
              }
              uVar30 = uVar27 + iVar31;
              uVar24 = 0;
              if (-1 < *(char *)((long)param + 0xb08)) {
                *(byte *)((long)param + 0xb05) = bVar6 & ~bVar20;
              }
              goto LAB_0016769d;
            }
LAB_00167625:
            uVar17 = (ulong)(bVar7 & 0xf);
            if ((uVar16 & 1) != 0) {
              uVar17 = (ulong)(bVar7 >> 4);
            }
            uVar24 = (int)k054539_update::dpcm[uVar17] + uVar28;
            if (0x7ffe < (int)uVar24) {
              uVar24 = 0x7fff;
            }
            if ((int)uVar24 < -0x7fff) {
              uVar24 = 0xffff8000;
            }
            uVar30 = uVar27 + iVar31;
          } while (0xffff < uVar27 + iVar31);
          uVar30 = uVar27 + iVar31;
        }
LAB_0016769d:
        uVar30 = (uVar16 & 1) << 0xf | (int)uVar30 >> 1;
        uVar16 = uVar16 >> 1;
      }
    }
    else {
      *puVar29 = uVar16;
      uVar28 = 0;
      uVar23 = 0;
      uVar24 = 0;
      uVar26 = 0;
      uVar30 = 0;
      switch(*(byte *)((long)param + lVar18 * 2 + 0xad9) >> 2 & 3) {
      case 0:
        goto switchD_001673d6_caseD_0;
      case 1:
        goto switchD_001673d6_caseD_1;
      case 2:
        goto switchD_001673d6_caseD_2;
      }
    }
    goto switchD_001673d6_caseD_3;
  }
  goto LAB_0016773c;
LAB_00167599:
  uVar30 = uVar26 + iVar31;
  uVar24 = 0;
  if (-1 < *(char *)((long)param + 0xb08)) {
    *(byte *)((long)param + 0xb05) = bVar6 & ~bVar20;
  }
switchD_001673d6_caseD_3:
  auVar35._8_8_ = dVar34 * dVar37 * dVar4;
  auVar35._0_8_ = dVar34 * dVar37 * dVar3;
  auVar35 = minpd(auVar15,auVar35);
  dVar34 = 1.8;
  if (dVar36 <= 1.8) {
    dVar34 = dVar36;
  }
  dVar37 = (double)(int)uVar24;
  psVar2 = (short *)(lVar13 + (ulong)((uint)(uVar10 >> 3) + (uint)uVar11 * 2 & 0x1fff) * 2);
  *psVar2 = *psVar2 + (short)(int)(dVar34 * dVar37);
  dVar32 = dVar32 + dVar37 * auVar35._0_8_;
  dVar33 = dVar33 + dVar37 * auVar35._8_8_;
  *puVar29 = uVar16;
  puVar29[1] = uVar30;
  puVar29[3] = uVar28;
  puVar29[2] = uVar24;
  if (-1 < *(char *)((long)param + 0xb08)) {
    *(char *)((long)param + lVar19 + 0x8e5) = (char)uVar16;
    *(char *)((long)param + lVar19 + 0x8e6) = (char)(uVar16 >> 8);
    *(char *)((long)param + lVar19 + 0x8e7) = (char)(uVar16 >> 0x10);
  }
LAB_0016773c:
  lVar18 = lVar18 + 1;
  if (lVar18 == 8) goto code_r0x00167749;
  goto LAB_0016725a;
code_r0x00167749:
  uVar16 = *(int *)((long)param + 0xb18) + 1U & 0x1fff;
  uVar17 = (ulong)uVar16;
  *(short *)((long)param + 0xb18) = (short)uVar16;
  (*outputs)[uVar21] = (int)dVar33;
  outputs[1][uVar21] = (int)dVar32;
  uVar21 = uVar21 + 1;
  if (uVar21 == samples) {
    return;
  }
  goto LAB_00167226;
}

Assistant:

static void k054539_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	k054539_state *info = (k054539_state *)param;
#define VOL_CAP 1.80

	static const INT16 dpcm[16] = {
		0 * 0x100,     1 * 0x100,   4 * 0x100,   9 * 0x100,  16 * 0x100, 25 * 0x100, 36 * 0x100, 49 * 0x100,
		-64 * 0x100, -49 * 0x100, -36 * 0x100, -25 * 0x100, -16 * 0x100, -9 * 0x100, -4 * 0x100, -1 * 0x100
	};

	INT16 *rbase = (INT16 *)info->ram;
	UINT32 sample, ch;

	if(!(info->regs[0x22f] & 1))
	{
		memset(outputs[0], 0, samples*sizeof(*outputs[0]));
		memset(outputs[1], 0, samples*sizeof(*outputs[1]));
		return;
	}

	for(sample = 0; sample != samples; sample++) {
		double lval, rval;
		if(!(info->flags & K054539_DISABLE_REVERB))
			lval = rval = rbase[info->reverb_pos];
		else
			lval = rval = 0;
		rbase[info->reverb_pos] = 0;

		for(ch=0; ch<8; ch++)
			if(info->regs[0x22c] & (1<<ch) && ! info->Muted[ch]) {
				UINT8 *base1 = info->regs + 0x20*ch;
				UINT8 *base2 = info->regs + 0x200 + 0x2*ch;
				k054539_channel *chan = info->channels + ch;
				int delta, vol, bval, pan;
				double cur_gain, lvol, rvol, rbvol;
				UINT32 cur_pos;
				int rdelta, fdelta, pdelta;
				int cur_pfrac, cur_val, cur_pval;

				delta = base1[0x00] | (base1[0x01] << 8) | (base1[0x02] << 16);

				vol = base1[0x03];

				bval = vol + base1[0x04];
				if (bval > 255)
					bval = 255;

				pan = base1[0x05];
				// DJ Main: 81-87 right, 88 middle, 89-8f left
				if (pan >= 0x81 && pan <= 0x8f)
					pan -= 0x81;
				else if (pan >= 0x11 && pan <= 0x1f)
					pan -= 0x11;
				else
					pan = 0x18 - 0x11;

				cur_gain = info->gain[ch];

				lvol = info->voltab[vol] * info->pantab[pan] * cur_gain;
				if (lvol > VOL_CAP)
					lvol = VOL_CAP;

				rvol = info->voltab[vol] * info->pantab[0xe - pan] * cur_gain;
				if (rvol > VOL_CAP)
					rvol = VOL_CAP;

				rbvol= info->voltab[bval] * cur_gain / 2;
				if (rbvol > VOL_CAP)
					rbvol = VOL_CAP;

				rdelta = (base1[6] | (base1[7] << 8)) >> 3;
				rdelta = (rdelta + info->reverb_pos) & 0x3fff;

				cur_pos = base1[0x0c] | (base1[0x0d] << 8) | (base1[0x0e] << 16);

				if(base2[0] & 0x20) {
					delta = -delta;
					fdelta = +0x10000;
					pdelta = -1;
				} else {
					fdelta = -0x10000;
					pdelta = +1;
				}

				if(cur_pos != chan->pos) {
					chan->pos = cur_pos;
					cur_pfrac = 0;
					cur_val = 0;
					cur_pval = 0;
				} else {
					cur_pfrac = chan->pfrac;
					cur_val = chan->val;
					cur_pval = chan->pval;
				}

				switch(base2[0] & 0xc) {
				case 0x0: { // 8bit pcm
					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] << 8);
						if(cur_val == (INT16)0x8000 && (base2[1] & 1)) {
							cur_pos = base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16);
							cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] << 8);
						}
						if(cur_val == (INT16)0x8000) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
					}
					break;
				}

				case 0x4: { // 16bit pcm lsb first
					pdelta <<= 1;

					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] | info->rom[(cur_pos+1) & info->rom_mask]<<8);
						if(cur_val == (INT16)0x8000 && (base2[1] & 1)) {
							cur_pos = base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16);
							cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] | info->rom[(cur_pos+1) & info->rom_mask]<<8);
						}
						if(cur_val == (INT16)0x8000) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
					}
					break;
				}

				case 0x8: { // 4bit dpcm
					cur_pos <<= 1;
					cur_pfrac <<= 1;
					if(cur_pfrac & 0x10000) {
						cur_pfrac &= 0xffff;
						cur_pos |= 1;
					}

					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = info->rom[(cur_pos>>1) & info->rom_mask];
						if(cur_val == 0x88 && (base2[1] & 1)) {
							cur_pos = (base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16)) << 1;
							cur_val = info->rom[(cur_pos>>1) & info->rom_mask];
						}
						if(cur_val == 0x88) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
						if(cur_pos & 1)
							cur_val >>= 4;
						else
							cur_val &= 15;
						cur_val = cur_pval + dpcm[cur_val];
						if(cur_val < -32768)
							cur_val = -32768;
						else if(cur_val > 32767)
							cur_val = 32767;
					}

					cur_pfrac >>= 1;
					if(cur_pos & 1)
						cur_pfrac |= 0x8000;
					cur_pos >>= 1;
					break;
				}
				default:
					LOG(("Unknown sample type %x for channel %d\n", base2[0] & 0xc, ch));
					break;
				}
				lval += cur_val * lvol;
				rval += cur_val * rvol;
				rbase[(rdelta + info->reverb_pos) & 0x1fff] += (INT16)(cur_val*rbvol);

				chan->pos = cur_pos;
				chan->pfrac = cur_pfrac;
				chan->pval = cur_pval;
				chan->val = cur_val;

				if(k054539_regupdate(info)) {
					base1[0x0c] = cur_pos     & 0xff;
					base1[0x0d] = cur_pos>> 8 & 0xff;
					base1[0x0e] = cur_pos>>16 & 0xff;
				}
			}
		info->reverb_pos = (info->reverb_pos + 1) & 0x1fff;
		outputs[0][sample] = (DEV_SMPL)lval;
		outputs[1][sample] = (DEV_SMPL)rval;
	}
}